

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

file_status __thiscall
boost::filesystem::directory_entry::m_get_symlink_status(directory_entry *this,error_code *ec)

{
  int iVar1;
  error_code *in_RDX;
  int local_20;
  int local_1c;
  
  iVar1 = *(int *)((long)&ec[2].m_cat + 4);
  if (*(int *)&ec[2].m_cat == 0 || iVar1 == 0xffff) {
    detail::symlink_status((detail *)&local_20,(path *)ec,in_RDX);
    *(int *)&ec[2].m_cat = local_20;
    *(int *)((long)&ec[2].m_cat + 4) = local_1c;
  }
  else {
    local_20 = *(int *)&ec[2].m_cat;
    local_1c = iVar1;
    if (in_RDX != (error_code *)0x0) {
      system::error_code::clear(in_RDX);
      local_20 = *(int *)&ec[2].m_cat;
      local_1c = *(int *)((long)&ec[2].m_cat + 4);
    }
  }
  *(int *)&(this->m_path).m_pathname._M_dataplus._M_p = local_20;
  *(int *)((long)&(this->m_path).m_pathname._M_dataplus._M_p + 4) = local_1c;
  return (file_status)this;
}

Assistant:

file_status
  directory_entry::m_get_symlink_status(system::error_code* ec) const
  {
    if (!status_known(m_symlink_status))
      m_symlink_status = detail::symlink_status(m_path, ec);
    else if (ec != 0) ec->clear();
    return m_symlink_status;
  }